

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer.cc
# Opt level: O0

t_pvalue __thiscall
xemmai::t_type_of<long>::f__multiply(t_type_of<long> *this,intptr_t a_self,t_pvalue *a_value)

{
  bool bVar1;
  uintptr_t uVar2;
  t_object *a_object;
  long *plVar3;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 extraout_RDX;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 extraout_RDX_00;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 extraout_RDX_01;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 aVar4;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> bVar5;
  t_pvalue tVar6;
  wstring_view a_message;
  xemmai *local_38;
  t_object *p;
  t_pvalue *a_value_local;
  intptr_t a_self_local;
  
  uVar2 = t_value<xemmai::t_pointer>::f_tag(a_value);
  if (uVar2 == 3) {
    t_value<xemmai::t_pointer>::t_value<long,_true>
              ((t_value<xemmai::t_pointer> *)this,a_self * (a_value->field_0).v_integer);
    aVar4 = extraout_RDX;
  }
  else if (uVar2 == 4) {
    t_value<xemmai::t_pointer>::t_value
              ((t_value<xemmai::t_pointer> *)this,(double)a_self * (a_value->field_0).v_float);
    aVar4 = extraout_RDX_00;
  }
  else {
    a_object = t_pointer::operator_cast_to_t_object_(&a_value->super_t_pointer);
    bVar1 = f_is<long>(a_object);
    if (!bVar1) {
      bVar5 = sv(L"not supported.",0xe);
      a_message._M_str = bVar5._M_str;
      local_38 = (xemmai *)bVar5._M_len;
      a_message._M_len = (size_t)a_message._M_str;
      f_throw(local_38,a_message);
    }
    plVar3 = t_object::f_as<long>(a_object);
    t_value<xemmai::t_pointer>::t_value<long,_true>
              ((t_value<xemmai::t_pointer> *)this,a_self * *plVar3);
    aVar4 = extraout_RDX_01;
  }
  tVar6.field_0.v_integer = aVar4.v_integer;
  tVar6.super_t_pointer.v_p = (t_object *)this;
  return tVar6;
}

Assistant:

t_pvalue t_type_of<intptr_t>::f__multiply(intptr_t a_self, const t_pvalue& a_value)
{
	switch (a_value.f_tag()) {
	case c_tag__INTEGER:
		return a_self * a_value.v_integer;
	case c_tag__FLOAT:
		return a_self * a_value.v_float;
	}
	t_object* p = a_value;
	if (f_is<intptr_t>(p)) return a_self * p->f_as<intptr_t>();
	f_throw(L"not supported."sv);
}